

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O3

void __thiscall CVmPoolPaged::~CVmPoolPaged(CVmPoolPaged *this)

{
  *(undefined ***)this = &PTR__CVmPoolPaged_00368518;
  if (this->pages_ != (CVmPool_pg *)0x0) {
    free(this->pages_);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~CVmPoolPaged() { terminate_nv(); }